

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O2

void __thiscall
GEO::geofile::pull_points(geofile *this,vector<GEO::point,_std::allocator<GEO::point>_> *in_vector)

{
  _Base_ptr p_Var1;
  _Self __tmp;
  
  if ((this->points_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var1 = (this->points_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->points_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      std::vector<GEO::point,_std::allocator<GEO::point>_>::push_back
                (in_vector,(value_type *)&p_Var1[1]._M_parent);
    }
  }
  return;
}

Assistant:

void GEO::geofile::pull_points(std::vector<GEO::point> &in_vector)
{
//std::map<int, point>            points_map;
    if (points_map.size()>0)
    {
        auto pm_end = points_map.end();
        for ( auto pm_it = points_map.begin();
             pm_it != pm_end; pm_it++)
        {
            in_vector.push_back(pm_it->second);
        }
    }
}